

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tif_getimage.c
# Opt level: O1

int gtStripSeparate(TIFFRGBAImage *img,uint32_t *raster,uint32_t w,uint32_t h)

{
  int iVar1;
  TIFF *tif;
  undefined1 auVar2 [16];
  uchar *puVar3;
  uint uVar4;
  uint32_t uVar5;
  ulong uVar6;
  char *pcVar7;
  tmsize_t tVar8;
  int iVar9;
  ulong uVar10;
  ulong uVar11;
  uint32_t *puVar12;
  uint32_t *puVar13;
  uint32_t uVar14;
  byte bVar15;
  uint uVar16;
  int iVar17;
  int iVar18;
  bool bVar19;
  int local_ec;
  uchar *buf;
  uint local_b0;
  uint32_t rowsperstrip;
  uchar *local_a8;
  uchar *local_a0;
  uchar *local_98;
  ulong local_90;
  uchar *local_88;
  ulong local_80;
  uint local_74;
  tmsize_t local_70;
  ulong local_68;
  ulong local_60;
  uint32_t *local_58;
  ulong local_50;
  long local_48;
  tmsize_t local_40;
  anon_union_8_3_994a2fbf_for_put local_38;
  
  tif = img->tif;
  local_38 = img->put;
  buf = (uchar *)0x0;
  iVar1 = img->alpha;
  local_90 = (ulong)img->width;
  local_70 = TIFFStripSize(tif);
  local_40 = _TIFFMultiplySSize(tif,4 - (ulong)(iVar1 == 0),local_70,"gtStripSeparate");
  if (local_40 == 0) {
LAB_002a971f:
    local_ec = 0;
  }
  else {
    local_b0 = setorientation(img);
    local_68 = 0;
    if ((local_b0 & 1) != 0) {
      if ((int)w < 0) {
        pcVar7 = TIFFFileName(tif);
        TIFFErrorExtR(tif,pcVar7,"Width overflow");
        return 0;
      }
      local_68 = (ulong)(w * -2);
    }
    iVar18 = *(int *)&img->photometric;
    bVar19 = (ushort)iVar18 < 4;
    uVar16 = 3;
    if (bVar19) {
      uVar16 = (uint)(0x1000300010001 >> ((byte)(iVar18 << 4) & 0x3f));
    }
    local_58 = raster;
    TIFFGetFieldDefaulted(tif,0x116,&rowsperstrip);
    uVar6 = TIFFScanlineSize(tif);
    uVar4 = (uint)local_90;
    local_90 = (ulong)(uVar4 - w);
    if (uVar4 < w) {
      local_90 = 0;
    }
    local_60 = (ulong)w;
    local_50 = (ulong)w;
    if (h == 0) {
      local_ec = 1;
    }
    else {
      bVar15 = bVar19 & 0xbU >> ((byte)iVar18 & 0xf);
      local_48 = local_70 * 3;
      local_ec = 1;
      local_74 = uVar16 & 0xffff;
      local_88 = (uchar *)0x0;
      local_a0 = (uchar *)0x0;
      local_a8 = (uchar *)0x0;
      local_98 = (uchar *)0x0;
      uVar11 = 0;
      do {
        puVar3 = buf;
        iVar17 = (int)uVar11;
        uVar14 = img->row_offset + iVar17;
        iVar9 = rowsperstrip - uVar14 % rowsperstrip;
        iVar18 = h - iVar17;
        if ((uint)(iVar9 + iVar17) <= h) {
          iVar18 = iVar9;
        }
        uVar10 = (ulong)(uVar14 % rowsperstrip + iVar18);
        if (((long)uVar6 < 1) ||
           (auVar2._8_8_ = 0, auVar2._0_8_ = uVar6,
           uVar10 <= SUB168((ZEXT416(0) << 0x40 | ZEXT816(0x7fffffffffffffff)) / auVar2,0))) {
          local_80 = uVar11;
          uVar5 = TIFFComputeStrip(tif,uVar14,0);
          if (puVar3 != (uchar *)0x0) {
            tVar8 = TIFFReadEncodedStrip(tif,uVar5,local_88,uVar6 * uVar10);
            if ((tVar8 != -1) || (uVar11 = local_80, img->stoponerr == 0)) goto LAB_002a952c;
LAB_002a96f3:
            iVar17 = 3;
            local_ec = 0;
            goto LAB_002a9700;
          }
          tVar8 = _TIFFReadEncodedStripAndAllocBuffer(tif,uVar5,&buf,local_40,uVar6 * uVar10);
          iVar9 = (int)local_80;
          if ((tVar8 != -1) || ((buf != (uchar *)0x0 && (img->stoponerr == 0)))) {
            local_88 = buf;
            if (bVar15 == 0) {
              local_a0 = buf + local_70;
              local_a8 = local_a0 + local_70;
              local_98 = (uchar *)0x0;
              if (iVar1 != 0) {
                local_98 = local_a8 + local_70;
              }
            }
            else {
              local_98 = (uchar *)0x0;
              if (iVar1 != 0) {
                local_98 = buf + local_48;
              }
              local_a8 = buf;
              local_a0 = buf;
            }
LAB_002a952c:
            uVar11 = local_80;
            iVar9 = (int)local_80;
            if (bVar15 == 0) {
              uVar5 = TIFFComputeStrip(tif,uVar14,1);
              tVar8 = TIFFReadEncodedStrip(tif,uVar5,local_a0,uVar6 * uVar10);
              if ((tVar8 == -1) && (img->stoponerr != 0)) goto LAB_002a96d0;
              uVar5 = TIFFComputeStrip(tif,uVar14,2);
              tVar8 = TIFFReadEncodedStrip(tif,uVar5,local_a8,uVar6 * uVar10);
              if ((tVar8 == -1) && (img->stoponerr != 0)) goto LAB_002a96f3;
            }
            if (iVar1 != 0) {
              uVar14 = TIFFComputeStrip(tif,uVar14,(uint16_t)local_74);
              tVar8 = TIFFReadEncodedStrip(tif,uVar14,local_98,uVar10 * uVar6);
              if ((tVar8 == -1) && (img->stoponerr != 0)) goto LAB_002a96f3;
            }
            iVar17 = 0;
            (*local_38.any)(img);
            goto LAB_002a9700;
          }
LAB_002a96d0:
          iVar17 = 3;
          local_ec = 0;
        }
        else {
          pcVar7 = TIFFFileName(tif);
          TIFFErrorExtR(tif,pcVar7,"Integer overflow in gtStripSeparate");
          iVar17 = 1;
LAB_002a9700:
          iVar9 = (int)uVar11;
        }
        if (iVar17 != 0) {
          if (iVar17 != 3) goto LAB_002a971f;
          break;
        }
        uVar11 = (ulong)(uint)(iVar18 + iVar9);
      } while ((uint)(iVar18 + iVar9) < h);
    }
    if (h != 0 && 1 < local_b0) {
      uVar6 = 0;
      uVar11 = 0;
      do {
        puVar12 = local_58 + (uint)((int)uVar11 * (int)local_50) + (local_60 - 1);
        if (local_58 + (uint)((int)uVar11 * (int)local_50) < puVar12) {
          puVar13 = local_58 + uVar6 + 1;
          do {
            uVar14 = puVar13[-1];
            puVar13[-1] = *puVar12;
            *puVar12 = uVar14;
            puVar12 = puVar12 + -1;
            bVar19 = puVar13 < puVar12;
            puVar13 = puVar13 + 1;
          } while (bVar19);
        }
        uVar11 = uVar11 + 1;
        uVar6 = (ulong)(uint)((int)uVar6 + (int)local_50);
      } while (uVar11 != h);
    }
    _TIFFfreeExt(img->tif,buf);
  }
  return local_ec;
}

Assistant:

static int gtStripSeparate(TIFFRGBAImage *img, uint32_t *raster, uint32_t w,
                           uint32_t h)
{
    TIFF *tif = img->tif;
    tileSeparateRoutine put = img->put.separate;
    unsigned char *buf = NULL;
    unsigned char *p0 = NULL, *p1 = NULL, *p2 = NULL, *pa = NULL;
    uint32_t row, y, nrow, rowstoread;
    tmsize_t pos;
    tmsize_t scanline;
    uint32_t rowsperstrip, offset_row;
    uint32_t imagewidth = img->width;
    tmsize_t stripsize;
    tmsize_t bufsize;
    int32_t fromskew, toskew;
    int alpha = img->alpha;
    int ret = 1, flip;
    uint16_t colorchannels;

    stripsize = TIFFStripSize(tif);
    bufsize =
        _TIFFMultiplySSize(tif, alpha ? 4 : 3, stripsize, "gtStripSeparate");
    if (bufsize == 0)
    {
        return (0);
    }

    flip = setorientation(img);
    if (flip & FLIP_VERTICALLY)
    {
        if (w > INT_MAX)
        {
            TIFFErrorExtR(tif, TIFFFileName(tif), "Width overflow");
            return (0);
        }
        y = h - 1;
        toskew = -(int32_t)(w + w);
    }
    else
    {
        y = 0;
        toskew = -(int32_t)(w - w);
    }

    switch (img->photometric)
    {
        case PHOTOMETRIC_MINISWHITE:
        case PHOTOMETRIC_MINISBLACK:
        case PHOTOMETRIC_PALETTE:
            colorchannels = 1;
            break;

        default:
            colorchannels = 3;
            break;
    }

    TIFFGetFieldDefaulted(tif, TIFFTAG_ROWSPERSTRIP, &rowsperstrip);
    scanline = TIFFScanlineSize(tif);
    fromskew = (w < imagewidth ? imagewidth - w : 0);
    for (row = 0; row < h; row += nrow)
    {
        uint32_t temp;
        rowstoread = rowsperstrip - (row + img->row_offset) % rowsperstrip;
        nrow = (row + rowstoread > h ? h - row : rowstoread);
        offset_row = row + img->row_offset;
        temp = (row + img->row_offset) % rowsperstrip + nrow;
        if (scanline > 0 && temp > (size_t)(TIFF_TMSIZE_T_MAX / scanline))
        {
            TIFFErrorExtR(tif, TIFFFileName(tif),
                          "Integer overflow in gtStripSeparate");
            return 0;
        }
        if (buf == NULL)
        {
            if (_TIFFReadEncodedStripAndAllocBuffer(
                    tif, TIFFComputeStrip(tif, offset_row, 0), (void **)&buf,
                    bufsize, temp * scanline) == (tmsize_t)(-1) &&
                (buf == NULL || img->stoponerr))
            {
                ret = 0;
                break;
            }
            p0 = buf;
            if (colorchannels == 1)
            {
                p2 = p1 = p0;
                pa = (alpha ? (p0 + 3 * stripsize) : NULL);
            }
            else
            {
                p1 = p0 + stripsize;
                p2 = p1 + stripsize;
                pa = (alpha ? (p2 + stripsize) : NULL);
            }
        }
        else if (TIFFReadEncodedStrip(tif, TIFFComputeStrip(tif, offset_row, 0),
                                      p0, temp * scanline) == (tmsize_t)(-1) &&
                 img->stoponerr)
        {
            ret = 0;
            break;
        }
        if (colorchannels > 1 &&
            TIFFReadEncodedStrip(tif, TIFFComputeStrip(tif, offset_row, 1), p1,
                                 temp * scanline) == (tmsize_t)(-1) &&
            img->stoponerr)
        {
            ret = 0;
            break;
        }
        if (colorchannels > 1 &&
            TIFFReadEncodedStrip(tif, TIFFComputeStrip(tif, offset_row, 2), p2,
                                 temp * scanline) == (tmsize_t)(-1) &&
            img->stoponerr)
        {
            ret = 0;
            break;
        }
        if (alpha)
        {
            if (TIFFReadEncodedStrip(
                    tif, TIFFComputeStrip(tif, offset_row, colorchannels), pa,
                    temp * scanline) == (tmsize_t)(-1) &&
                img->stoponerr)
            {
                ret = 0;
                break;
            }
        }

        pos = ((row + img->row_offset) % rowsperstrip) * scanline +
              ((tmsize_t)img->col_offset * img->samplesperpixel);
        tmsize_t roffset = (tmsize_t)y * w;
        (*put)(img, raster + roffset, 0, y, w, nrow, fromskew, toskew, p0 + pos,
               p1 + pos, p2 + pos, (alpha ? (pa + pos) : NULL));
        y += ((flip & FLIP_VERTICALLY) ? -(int32_t)nrow : (int32_t)nrow);
    }

    if (flip & FLIP_HORIZONTALLY)
    {
        uint32_t line;

        for (line = 0; line < h; line++)
        {
            uint32_t *left = raster + (line * w);
            uint32_t *right = left + w - 1;

            while (left < right)
            {
                uint32_t temp = *left;
                *left = *right;
                *right = temp;
                left++;
                right--;
            }
        }
    }

    _TIFFfreeExt(img->tif, buf);
    return (ret);
}